

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPcmp(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  fsfix fVar2;
  bool bVar3;
  svalue_t right;
  svalue_t left;
  
  left.string.Chars = FString::NullString.Nothing;
  right.type = 1;
  left.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  right.string.Chars = FString::NullString.Nothing;
  right.value.i = 0;
  left.type = right.type;
  EvaluateExpression(this,&left,start,n + -1);
  EvaluateExpression(this,&right,n + 1,stop);
  result->type = 1;
  if (left.type == 0 && right.type == 0) {
    iVar1 = strcmp(left.string.Chars,right.string.Chars);
    bVar3 = iVar1 == 0;
  }
  else if (right.type == 2 && left.type == 2) {
    bVar3 = CONCAT44(left.value._4_4_,left.value.i) == CONCAT44(right.value._4_4_,right.value.i);
  }
  else {
    if (right.type == 6 || left.type == 6) {
      fVar2 = fixedvalue(&left);
      iVar1 = fixedvalue(&right);
    }
    else {
      fVar2 = intvalue(&left);
      iVar1 = intvalue(&right);
    }
    bVar3 = fVar2 == iVar1;
  }
  *(uint *)&result->value = (uint)bVar3;
  FString::~FString(&right.string);
  FString::~FString(&left.string);
  return;
}

Assistant:

void FParser::OPcmp(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	result.type = svt_int;        // always an int returned
	
	if(left.type == svt_string && right.type == svt_string)
	{
		result.value.i = !strcmp(left.string, right.string);
		return;
	}
	
	// haleyjd: direct mobj comparison when both are mobj
	if(left.type == svt_mobj && right.type == svt_mobj)
	{
		// we can safely assume reference equivalency for
		// AActor's in all cases since they are static for the
		// duration of a level
		result.value.i = (left.value.mobj == right.value.mobj);
		return;
	}
	
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.value.i = (fixedvalue(left) == fixedvalue(right));
		return;
	}
	
	result.value.i = (intvalue(left) == intvalue(right));
}